

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec,xmlChar *value,void *data)

{
  int iVar1;
  xmlRegInputTokenPtr pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = exec->inputStackMax;
  if (exec->inputStackNr + 1 < iVar1) {
LAB_0017f695:
    if (value == (xmlChar *)0x0) {
      exec->inputStack[exec->inputStackNr].value = (xmlChar *)0x0;
    }
    else {
      pxVar3 = xmlStrdup(value);
      exec->inputStack[exec->inputStackNr].value = pxVar3;
      if (pxVar3 == (xmlChar *)0x0) goto LAB_0017f6b7;
    }
    pxVar2 = exec->inputStack;
    iVar1 = exec->inputStackNr;
    pxVar2[iVar1].data = data;
    lVar4 = (long)iVar1 + 1;
    exec->inputStackNr = (int)lVar4;
    pxVar2 = pxVar2 + lVar4;
    pxVar2->value = (xmlChar *)0x0;
    pxVar2->data = (void *)0x0;
  }
  else {
    if (iVar1 < 1) {
      uVar6 = 4;
    }
    else {
      uVar6 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar5 = iVar1 + 1U >> 1;
        uVar6 = uVar5 + iVar1;
        if ((int)(1000000000 - uVar5) < iVar1) {
          uVar6 = 1000000000;
        }
      }
    }
    if ((-1 < (int)uVar6) &&
       (pxVar2 = (xmlRegInputTokenPtr)(*xmlRealloc)(exec->inputStack,(ulong)uVar6 << 4),
       pxVar2 != (xmlRegInputTokenPtr)0x0)) {
      exec->inputStack = pxVar2;
      exec->inputStackMax = uVar6;
      goto LAB_0017f695;
    }
LAB_0017f6b7:
    exec->status = -5;
  }
  return;
}

Assistant:

static void
xmlFARegExecSaveInputString(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                    void *data) {
    if (exec->inputStackNr + 1 >= exec->inputStackMax) {
	xmlRegInputTokenPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(exec->inputStackMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (newSize < 2)
            newSize = 2;
#endif
	tmp = xmlRealloc(exec->inputStack, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return;
	}
	exec->inputStack = tmp;
	exec->inputStackMax = newSize;
    }
    if (value == NULL) {
        exec->inputStack[exec->inputStackNr].value = NULL;
    } else {
        exec->inputStack[exec->inputStackNr].value = xmlStrdup(value);
        if (exec->inputStack[exec->inputStackNr].value == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
            return;
        }
    }
    exec->inputStack[exec->inputStackNr].data = data;
    exec->inputStackNr++;
    exec->inputStack[exec->inputStackNr].value = NULL;
    exec->inputStack[exec->inputStackNr].data = NULL;
}